

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject_factory.cpp
# Opt level: O2

void __thiscall
bidfx_public_api::price::subject::SubjectFactory::FX::FXBase::SetSettlementDate
          (FXBase *this,string *tenor_key,string *settlement_key,Date *date)

{
  FX *pFVar1;
  bool bVar2;
  string local_50;
  
  bVar2 = SubjectBuilder::ContainsKey
                    (&(this->outer_class_->super_MandatoryFieldsSubjectCreator).subject_builder_,
                     tenor_key);
  if (!bVar2) {
    pFVar1 = this->outer_class_;
    Tenor::ToString_abi_cxx11_(&local_50,(Tenor *)Tenor::BROKEN_DATE);
    SubjectBuilder::SetComponent
              (&(pFVar1->super_MandatoryFieldsSubjectCreator).subject_builder_,tenor_key,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  pFVar1 = this->outer_class_;
  tools::Date::ToString_abi_cxx11_(&local_50,date);
  SubjectBuilder::SetComponent
            (&(pFVar1->super_MandatoryFieldsSubjectCreator).subject_builder_,settlement_key,
             &local_50);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void SubjectFactory::FX::FXBase::SetSettlementDate(const std::string& tenor_key, const std::string& settlement_key, Date* date)
{
    if (!outer_class_.subject_builder_.ContainsKey(tenor_key))
    {
        outer_class_.subject_builder_.SetComponent(tenor_key, Tenor::BROKEN_DATE.ToString());
    }

    outer_class_.subject_builder_.SetComponent(settlement_key, date->ToString());
}